

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

string * __thiscall
cmGlobalGenerator::GenerateRuleFile
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *output)

{
  int iVar1;
  undefined4 extraout_var;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_40;
  undefined8 local_28;
  char *local_20;
  undefined8 local_18;
  char *replace;
  
  local_40.first._M_str = (output->_M_dataplus)._M_p;
  local_40.first._M_len = output->_M_string_length;
  local_40.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_28 = 5;
  local_20 = ".rule";
  local_18 = 0;
  views._M_len = 2;
  views._M_array = &local_40;
  cmCatViews(__return_storage_ptr__,views);
  iVar1 = (*this->_vptr_cmGlobalGenerator[0x17])(this);
  replace = (char *)CONCAT44(extraout_var,iVar1);
  if ((replace != (char *)0x0) && (*replace == '$')) {
    cmsys::SystemTools::ReplaceString(__return_storage_ptr__,replace,"/CMakeFiles");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GenerateRuleFile(
  std::string const& output) const
{
  std::string ruleFile = cmStrCat(output, ".rule");
  const char* dir = this->GetCMakeCFGIntDir();
  if (dir && dir[0] == '$') {
    cmSystemTools::ReplaceString(ruleFile, dir, "/CMakeFiles");
  }
  return ruleFile;
}